

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O3

void __thiscall ddd::DictionaryMLT<true,_false>::rebuild(DictionaryMLT<true,_false> *this)

{
  pointer ptVar1;
  thread *th;
  pointer ptVar2;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  anon_class_8_1_8991fb9c_for__M_head_impl func;
  uint local_4c;
  vector<std::thread,_std::allocator<std::thread>_> local_48;
  thread local_30;
  anon_class_8_1_8991fb9c_for__M_head_impl local_28;
  
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.this = (DictionaryMLT<false,_false> *)this;
  std::vector<std::thread,_std::allocator<std::thread>_>::resize
            (&local_48,*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3);
  local_4c = 0;
  ptVar2 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar1 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (*(long *)(this + 0x18) != *(long *)(this + 0x10)) {
    do {
      std::thread::
      thread<ddd::DictionaryMLT<true,false>::rebuild()::_lambda(unsigned_int)_1_&,unsigned_int&,void>
                (&local_30,&local_28,&local_4c);
      if (local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[local_4c]._M_id._M_thread != 0) {
        std::terminate();
      }
      local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[local_4c]._M_id._M_thread =
           (native_handle_type)local_30._M_id._M_thread;
      local_4c = local_4c + 1;
      ptVar2 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      ptVar1 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while ((ulong)local_4c < (ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3));
  }
  for (; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_48);
  return;
}

Assistant:

void rebuild() {
    auto func = [&](uint32_t id) {
      if (suffix_subtries_[id]) {
        suffix_subtries_[id]->rebuild();
      }
    };

    std::vector<std::thread> threads;
    threads.resize(suffix_subtries_.size());
    for (uint32_t i = 0; i < suffix_subtries_.size(); ++i) {
      threads[i] = std::thread(func, i);
    }
    for (auto& th : threads) {
      th.join();
    }
  }